

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaUtils.cpp
# Opt level: O3

int nv::cuda::deviceCount(void)

{
  return 0;
}

Assistant:

int nv::cuda::deviceCount()
{
#if defined HAVE_CUDA
	int gpuCount = 0;

	cudaError_t result = cudaGetDeviceCount(&gpuCount);

	if (result == cudaSuccess)
	{
		return gpuCount;
	}
#endif
	return 0;
}